

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

bool cmLibDirsLinked(string *l,string *r)

{
  bool bVar1;
  __type _Var2;
  string sStack_58;
  string local_38;
  
  bVar1 = cmsys::SystemTools::FileIsSymlink(l);
  if ((!bVar1) && (bVar1 = cmsys::SystemTools::FileIsSymlink(r), !bVar1)) {
    return false;
  }
  cmsys::SystemTools::GetRealPath(&sStack_58,l,(string *)0x0);
  cmsys::SystemTools::GetRealPath(&local_38,r,(string *)0x0);
  _Var2 = std::operator==(&sStack_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return _Var2;
}

Assistant:

static bool cmLibDirsLinked(std::string const& l, std::string const& r)
{
  // Compare the real paths of the two directories.
  // Since our caller only changed the trailing component of each
  // directory, the real paths can be the same only if at least one of
  // the trailing components is a symlink.  Use this as an optimization
  // to avoid excessive realpath calls.
  return (cmSystemTools::FileIsSymlink(l) ||
          cmSystemTools::FileIsSymlink(r)) &&
    cmSystemTools::GetRealPath(l) == cmSystemTools::GetRealPath(r);
}